

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

void __thiscall JUnitTestOutput::writeTestSuiteSummary(JUnitTestOutput *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  SimpleString local_50;
  SimpleString buf;
  
  sVar2 = (this->impl_->results_).failureCount_;
  pcVar4 = SimpleString::asCharString(&(this->impl_->results_).group_);
  sVar3 = (this->impl_->results_).testCount_;
  uVar1 = (this->impl_->results_).groupExecTime_;
  uVar6 = uVar1 / 1000;
  pcVar5 = (*GetPlatformSpecificTimeString)();
  StringFromFormat((char *)&buf,
                   "<testsuite errors=\"0\" failures=\"%d\" hostname=\"localhost\" name=\"%s\" tests=\"%d\" time=\"%d.%03d\" timestamp=\"%s\">\n"
                   ,(ulong)(uint)sVar2,pcVar4,(ulong)(uint)sVar3,uVar6 & 0xffffffff,
                   (ulong)(uint)((int)uVar1 + (int)uVar6 * -1000),pcVar5);
  pcVar4 = SimpleString::asCharString(&buf);
  SimpleString::SimpleString(&local_50,pcVar4);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&buf);
  return;
}

Assistant:

void JUnitTestOutput::writeTestSuiteSummary()
{
    SimpleString
            buf =
                    StringFromFormat(
                            "<testsuite errors=\"0\" failures=\"%d\" hostname=\"localhost\" name=\"%s\" tests=\"%d\" time=\"%d.%03d\" timestamp=\"%s\">\n",
                            (int)impl_->results_.failureCount_,
                            impl_->results_.group_.asCharString(),
                            (int) impl_->results_.testCount_,
                            (int) (impl_->results_.groupExecTime_ / 1000), (int) (impl_->results_.groupExecTime_ % 1000),
                            GetPlatformSpecificTimeString());
    writeToFile(buf.asCharString());
}